

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::
Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined1 this_00 [8];
  ulong uVar4;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  File_Position FVar5;
  undefined8 *puVar6;
  Boxed_Value BVar7;
  string_view t_name;
  array<chaiscript::Boxed_Value,_2UL> p;
  undefined1 local_c8 [8];
  Function_Push_Pop fpp;
  undefined1 local_b0 [32];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  Type_Conversions_State local_70 [4];
  
  detail::Function_Push_Pop::Function_Push_Pop(&fpp,in_RDX);
  BVar7 = AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                    (&this->
                      super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                     ,(Dispatch_State *)
                      ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.
                      __align);
  local_c8 = (undefined1  [8])this;
  make_container<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value&>
            (&params,(chaiscript *)this,
             (Boxed_Value *)
             BVar7.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  lVar1 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  lVar2 = *(long *)(lVar1 + 0x50);
  uVar4 = *(long *)(lVar1 + 0x58) - lVar2;
  if (8 < uVar4) {
    lVar1 = *(long *)(lVar2 + 8);
    puVar3 = *(undefined8 **)(lVar1 + 0x58);
    for (puVar6 = *(undefined8 **)(lVar1 + 0x50); puVar6 != puVar3; puVar6 = puVar6 + 1) {
      AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 &p,(Dispatch_State *)*puVar6);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
      emplace_back<chaiscript::Boxed_Value>(&params,(Boxed_Value *)&p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p._M_elems[0].m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  p._M_elems[0].m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            params.
            super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    p._M_elems[0].m_data.
    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  p._M_elems[0].m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    p._M_elems[0].m_data.
    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(element_type *)0x0;
  }
  detail::Function_Push_Pop::save_params(&fpp,(Function_Params *)&p);
  this_00 = local_c8;
  FVar5.line = 0;
  FVar5.column = 0;
  local_b0._0_8_ =
       params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_b0._0_8_ = FVar5;
  }
  local_b0._8_8_ =
       params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      params.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_b0._8_8_ = FVar5;
  }
  chaiscript::detail::Dispatch_Engine::call_member
            ((Dispatch_Engine *)&p,(string *)(in_RDX->m_engine)._M_data,
             (atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves,
             (Function_Params *)&t_ss[3].m_stack_holder,SUB81(local_b0,0),
             (Type_Conversions_State *)(ulong)(8 < uVar4));
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p._M_elems[0].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(int *)(*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                                _M_rwlock + 8) + 8) == 7) {
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&p,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               (p._M_elems + 1),
               *(Dispatch_State **)
                (*(long *)(*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)
                                            ._M_impl._M_rwlock + 8) + 0x50) + 8));
    local_70[0].m_saves._M_data = (Conversion_Saves *)local_c8;
    t_name._M_str = (char *)0x2;
    t_name._M_len = (size_t)(in_RDX->m_engine)._M_data;
    local_70[0].m_conversions._M_data = (Type_Conversions *)&p;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)local_b0,t_name,(atomic_uint_fast32_t *)"[]",
               (Function_Params *)&t_ss[3].m_conversions,local_70);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    std::array<chaiscript::Boxed_Value,_2UL>::~array(&p);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&params);
  detail::Function_Push_Pop::~Function_Push_Pop(&fpp);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this_00;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        Boxed_Value retval = this->children[0]->eval(t_ss);
        auto params = make_vector(retval);

        bool has_function_params = false;
        if (this->children[1]->children.size() > 1) {
          has_function_params = true;
          for (const auto &child : this->children[1]->children[1]->children) {
            params.push_back(child->eval(t_ss));
          }
        }

        fpp.save_params(Function_Params{params});

        try {
          retval = t_ss->call_member(m_fun_name, m_loc, Function_Params{params}, has_function_params, t_ss.conversions());
        } catch (const exception::dispatch_error &e) {
          if (e.functions.empty()) {
            throw exception::eval_error("'" + m_fun_name + "' is not a function.");
          } else {
            throw exception::eval_error(std::string(e.what()) + " for function '" + m_fun_name + "'", e.parameters, e.functions, true, *t_ss);
          }
        } catch (detail::Return_Value &rv) {
          retval = std::move(rv.retval);
        }

        if (this->children[1]->identifier == AST_Node_Type::Array_Call) {
          try {
            std::array<Boxed_Value, 2> p{retval, this->children[1]->children[1]->eval(t_ss)};
            retval = t_ss->call_function("[]", m_array_loc, Function_Params{p}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Can not find appropriate array lookup operator '[]'.", e.parameters, e.functions, true, *t_ss);
          }
        }

        return retval;
      }